

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

char * canonical_charset_name(char *charset)

{
  int iVar1;
  size_t sVar2;
  char local_39;
  char *pcStack_38;
  char c;
  char *s;
  char *p;
  char cs [16];
  char *charset_local;
  
  cs._8_8_ = charset;
  if (((charset == (char *)0x0) || (*charset == '\0')) || (sVar2 = strlen(charset), 0xf < sVar2)) {
    return (char *)cs._8_8_;
  }
  pcStack_38 = (char *)cs._8_8_;
  s = (char *)&p;
  while (*pcStack_38 != '\0') {
    local_39 = *pcStack_38;
    if (('`' < local_39) && (local_39 < '{')) {
      local_39 = local_39 + -0x20;
    }
    *s = local_39;
    pcStack_38 = pcStack_38 + 1;
    s = s + 1;
  }
  *s = '\0';
  iVar1 = strcmp((char *)&p,"UTF-8");
  if ((iVar1 != 0) && (iVar1 = strcmp((char *)&p,"UTF8"), iVar1 != 0)) {
    iVar1 = strcmp((char *)&p,"UTF-16BE");
    if ((iVar1 != 0) && (iVar1 = strcmp((char *)&p,"UTF16BE"), iVar1 != 0)) {
      iVar1 = strcmp((char *)&p,"UTF-16LE");
      if ((iVar1 != 0) && (iVar1 = strcmp((char *)&p,"UTF16LE"), iVar1 != 0)) {
        iVar1 = strcmp((char *)&p,"CP932");
        if (iVar1 == 0) {
          return "CP932";
        }
        return (char *)cs._8_8_;
      }
      return "UTF-16LE";
    }
    return "UTF-16BE";
  }
  return "UTF-8";
}

Assistant:

static const char *
canonical_charset_name(const char *charset)
{
	char cs[16];
	char *p;
	const char *s;

	if (charset == NULL || charset[0] == '\0'
	    || strlen(charset) > 15)
		return (charset);

	/* Copy name to uppercase. */
	p = cs;
	s = charset;
	while (*s) {
		char c = *s++;
		if (c >= 'a' && c <= 'z')
			c -= 'a' - 'A';
		*p++ = c;
	}
	*p++ = '\0';

	if (strcmp(cs, "UTF-8") == 0 ||
	    strcmp(cs, "UTF8") == 0)
		return ("UTF-8");
	if (strcmp(cs, "UTF-16BE") == 0 ||
	    strcmp(cs, "UTF16BE") == 0)
		return ("UTF-16BE");
	if (strcmp(cs, "UTF-16LE") == 0 ||
	    strcmp(cs, "UTF16LE") == 0)
		return ("UTF-16LE");
	if (strcmp(cs, "CP932") == 0)
		return ("CP932");
	return (charset);
}